

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix.hpp
# Opt level: O0

double ising::square::transfer_matrix::free_energy(double beta,int Lx,int Ly,double J,double H)

{
  vector<double,_std::allocator<double>_> *this;
  allocator_type *__a;
  int in_ESI;
  int in_EDI;
  double dVar1;
  double in_XMM2_Qa;
  vector<double,_std::allocator<double>_> field;
  vector<double,_std::allocator<double>_> inter;
  vector<double,_std::allocator<double>_> *in_stack_000000a8;
  vector<double,_std::allocator<double>_> *in_stack_000000b0;
  int in_stack_000000b8;
  int in_stack_000000bc;
  double in_stack_000000c0;
  allocator_type *in_stack_ffffffffffffff68;
  value_type *in_stack_ffffffffffffff70;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar2;
  vector<double,_std::allocator<double>_> local_69 [3];
  double local_20;
  int local_10;
  int local_c;
  
  this = (vector<double,_std::allocator<double>_> *)(long)(in_EDI * in_ESI * 2);
  local_20 = in_XMM2_Qa;
  local_10 = in_ESI;
  local_c = in_EDI;
  std::allocator<double>::allocator((allocator<double> *)0x1030d9);
  std::vector<double,_std::allocator<double>_>::vector
            (this,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::allocator<double>::~allocator((allocator<double> *)0x103101);
  if ((local_20 != 0.0) || (NAN(local_20))) {
    iVar2 = local_c * local_10;
  }
  else {
    iVar2 = 0;
  }
  __a = (allocator_type *)(long)iVar2;
  this_00 = local_69;
  std::allocator<double>::allocator((allocator<double> *)0x10314e);
  std::vector<double,_std::allocator<double>_>::vector
            (this,CONCAT44(iVar2,in_stack_ffffffffffffff78),(value_type *)this_00,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x103176);
  dVar1 = free_energy(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b0,
                      in_stack_000000a8);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return dVar1;
}

Assistant:

static double free_energy(double beta, int Lx, int Ly, double J, double H = 0.0) {
    std::vector<double> inter(2 * Lx * Ly, J);
    std::vector<double> field((H != 0.0) ? (Lx * Ly) : 0, H);
    return free_energy(beta, Lx, Ly, inter, field);
  }